

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_read_fuzzer_common.h
# Opt level: O0

void fuzzer_read(zip_t *za,zip_error_t *error,char *password)

{
  FILE *pFVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  zip_file_t *f;
  char buf [32768];
  zip_int64_t ret;
  zip_int64_t n;
  zip_int64_t i;
  char *password_local;
  zip_error_t *error_local;
  zip_t *za_local;
  
  pFVar1 = _stderr;
  if (za == (zip_t *)0x0) {
    uVar3 = zip_error_strerror(error);
    fprintf(pFVar1,"Error opening archive: %s\n",uVar3);
    zip_error_fini(error);
  }
  else {
    zip_set_default_password(za,password);
    zip_error_fini(error);
    lVar4 = zip_get_num_entries(za,0);
    for (n = 0; n < lVar4; n = n + 1) {
      lVar5 = zip_fopen_index(za,n,0);
      pFVar1 = _stderr;
      if (lVar5 == 0) {
        uVar3 = zip_strerror(za);
        fprintf(pFVar1,"Error opening file %d: %s\n",n & 0xffffffff,uVar3);
      }
      else {
        do {
          buf._32760_8_ = zip_fread(lVar5,&f,0x8000);
          pFVar1 = _stderr;
        } while (0 < (long)buf._32760_8_);
        if ((long)buf._32760_8_ < 0) {
          uVar3 = zip_strerror(za);
          fprintf(pFVar1,"Error reading file %d: %s\n",n & 0xffffffff,uVar3);
        }
        iVar2 = zip_fclose(lVar5);
        pFVar1 = _stderr;
        if (iVar2 < 0) {
          uVar3 = zip_strerror(za);
          fprintf(pFVar1,"Error closing file %d: %s\n",n & 0xffffffff,uVar3);
        }
      }
    }
    iVar2 = zip_close(za);
    pFVar1 = _stderr;
    if (iVar2 < 0) {
      uVar3 = zip_strerror(za);
      fprintf(pFVar1,"Error closing archive: %s\n",uVar3);
      zip_discard(za);
    }
  }
  return;
}

Assistant:

void fuzzer_read(zip_t *za, zip_error_t *error, const char *password) {
    zip_int64_t i, n, ret;
    char buf[32768];

    if (za == NULL) {
        fprintf(stderr, "Error opening archive: %s\n", zip_error_strerror(error));
        zip_error_fini(error);
        return;
    }

    zip_set_default_password(za, password);

    zip_error_fini(error);

    n = zip_get_num_entries(za, 0);
    for (i = 0; i < n; i++) {
        zip_file_t *f = zip_fopen_index(za, i, 0);
        if (f == NULL) {
            fprintf(stderr, "Error opening file %d: %s\n", (int)i, zip_strerror(za));
            continue;
        }

        while ((ret = zip_fread(f, buf, sizeof(buf))) > 0) {
            ;
        }
        if (ret < 0) {
            fprintf(stderr, "Error reading file %d: %s\n", (int)i, zip_strerror(za));
        }
        if (zip_fclose(f) < 0) {
            fprintf(stderr, "Error closing file %d: %s\n", (int)i, zip_strerror(za));
            continue;
        }
    }
    if (zip_close(za) < 0) {
        fprintf(stderr, "Error closing archive: %s\n", zip_strerror(za));
        zip_discard(za);
    }
}